

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O2

Type * Fixpp::
       get<Fixpp::TagT<108u,Fixpp::Type::String>,Fixpp::VersionnedMessage<Fixpp::v42::Version,Fixpp::Chars<(char)65>,Fixpp::Required<Fixpp::TagT<98u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<108u,Fixpp::Type::String>>,Fixpp::TagT<95u,Fixpp::Type::String>,Fixpp::TagT<96u,Fixpp::Type::String>,Fixpp::TagT<141u,Fixpp::Type::String>,Fixpp::TagT<383u,Fixpp::Type::String>,Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>,Fixpp::TagT<2154u,Fixpp::Type::Int>>>
                 (VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::String>_>,_Fixpp::TagT<95U,_Fixpp::Type::String>,_Fixpp::TagT<96U,_Fixpp::Type::String>,_Fixpp::TagT<141U,_Fixpp::Type::String>,_Fixpp::TagT<383U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>,_Fixpp::TagT<2154U,_Fixpp::Type::Int>_>
                  *message)

{
  bool bVar1;
  runtime_error *this;
  
  bVar1 = std::bitset<8UL>::test
                    (&(message->
                      super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::String>_>,_Fixpp::TagT<95U,_Fixpp::Type::String>,_Fixpp::TagT<96U,_Fixpp::Type::String>,_Fixpp::TagT<141U,_Fixpp::Type::String>,_Fixpp::TagT<383U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>,_Fixpp::TagT<2154U,_Fixpp::Type::Int>_>
                      ).
                      super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::String>_>,_Fixpp::TagT<95U,_Fixpp::Type::String>,_Fixpp::TagT<96U,_Fixpp::Type::String>,_Fixpp::TagT<141U,_Fixpp::Type::String>,_Fixpp::TagT<383U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>,_Fixpp::TagT<2154U,_Fixpp::Type::Int>_>
                      .allBits,1);
  if (bVar1) {
    return (Type *)&(message->
                    super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::String>_>,_Fixpp::TagT<95U,_Fixpp::Type::String>,_Fixpp::TagT<96U,_Fixpp::Type::String>,_Fixpp::TagT<141U,_Fixpp::Type::String>,_Fixpp::TagT<383U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>,_Fixpp::TagT<2154U,_Fixpp::Type::Int>_>
                    ).
                    super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::String>_>,_Fixpp::TagT<95U,_Fixpp::Type::String>,_Fixpp::TagT<96U,_Fixpp::Type::String>,_Fixpp::TagT<141U,_Fixpp::Type::String>,_Fixpp::TagT<383U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>,_Fixpp::TagT<2154U,_Fixpp::Type::Int>_>
                    .values.base.
                    super_tuple_value<1UL,_Fixpp::Field<Fixpp::TagT<108U,_Fixpp::Type::String>_>,_false>
    ;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Bad tag access: tag is not present in message");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

decltype(auto)
    get(const Message& message)
    {
        using Index = details::TagIndex<typename Message::TagsList, Tag>;
        static_assert(Index::Valid, "Invalid tag for given message");

        if (!message.allBits.test(static_cast<size_t>(Index::Value)))
            throw std::runtime_error("Bad tag access: tag is not present in message");

        return meta::get<Index::Value>(message.values).get();
    }